

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADAFWSkew.h
# Opt level: O0

int __thiscall
COLLADAFW::Skew::clone(Skew *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  void *pvVar1;
  Skew *in_stack_ffffffffffffffe8;
  Skew *in_stack_fffffffffffffff0;
  
  pvVar1 = operator_new(0x60);
  Skew(in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  return (int)pvVar1;
}

Assistant:

virtual Skew* clone() const { return new Skew(*this); }